

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::computeQuadTexCoordCube
               (vector<float,_std::allocator<float>_> *dst,CubeFace face,Vec2 *bottomLeft,
               Vec2 *topRight)

{
  reference pvVar1;
  float fVar2;
  value_type local_40;
  float local_3c;
  float mSign;
  float tSign;
  float sSign;
  int mRow;
  int tRow;
  int sRow;
  Vec2 *topRight_local;
  Vec2 *bottomLeft_local;
  CubeFace face_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  mSign = 1.0;
  local_3c = 1.0;
  local_40 = 1.0;
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    tSign = 0.0;
    mRow = 2;
    sSign = 1.4013e-45;
    local_40 = -1.0;
    local_3c = -1.0;
    break;
  case CUBEFACE_POSITIVE_X:
    tSign = 0.0;
    mRow = 2;
    sSign = 1.4013e-45;
    mSign = -1.0;
    local_3c = -1.0;
    break;
  case CUBEFACE_NEGATIVE_Y:
    tSign = 1.4013e-45;
    mRow = 0;
    sSign = 2.8026e-45;
    local_40 = -1.0;
    local_3c = -1.0;
    break;
  case CUBEFACE_POSITIVE_Y:
    tSign = 1.4013e-45;
    mRow = 0;
    sSign = 2.8026e-45;
    break;
  case CUBEFACE_NEGATIVE_Z:
    tSign = 2.8026e-45;
    mRow = 0;
    sSign = 1.4013e-45;
    local_40 = -1.0;
    mSign = -1.0;
    local_3c = -1.0;
    break;
  case CUBEFACE_POSITIVE_Z:
    tSign = 2.8026e-45;
    mRow = 0;
    sSign = 1.4013e-45;
    local_3c = -1.0;
    break;
  default:
    goto switchD_011db867_default;
  }
  std::vector<float,_std::allocator<float>_>::resize(dst,0xc);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(int)tSign);
  *pvVar1 = local_40;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)((int)tSign + 3));
  *pvVar1 = local_40;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)((int)tSign + 6));
  *pvVar1 = local_40;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)((int)tSign + 9));
  *pvVar1 = local_40;
  fVar2 = tcu::Vector<float,_2>::x(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)mRow);
  *pvVar1 = mSign * fVar2;
  fVar2 = tcu::Vector<float,_2>::x(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(mRow + 3));
  *pvVar1 = mSign * fVar2;
  fVar2 = tcu::Vector<float,_2>::x(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(mRow + 6));
  *pvVar1 = mSign * fVar2;
  fVar2 = tcu::Vector<float,_2>::x(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(mRow + 9));
  *pvVar1 = mSign * fVar2;
  fVar2 = tcu::Vector<float,_2>::y(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)(int)sSign);
  *pvVar1 = local_3c * fVar2;
  fVar2 = tcu::Vector<float,_2>::y(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)((int)sSign + 3));
  *pvVar1 = local_3c * fVar2;
  fVar2 = tcu::Vector<float,_2>::y(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)((int)sSign + 6));
  *pvVar1 = local_3c * fVar2;
  fVar2 = tcu::Vector<float,_2>::y(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,(long)((int)sSign + 9));
  *pvVar1 = local_3c * fVar2;
switchD_011db867_default:
  return;
}

Assistant:

void computeQuadTexCoordCube (std::vector<float>& dst, tcu::CubeFace face, const tcu::Vec2& bottomLeft, const tcu::Vec2& topRight)
{
	int		sRow		= 0;
	int		tRow		= 0;
	int		mRow		= 0;
	float	sSign		= 1.0f;
	float	tSign		= 1.0f;
	float	mSign		= 1.0f;

	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X: mRow = 0; sRow = 2; tRow = 1; mSign = -1.0f;				   tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_X: mRow = 0; sRow = 2; tRow = 1;				sSign = -1.0f; tSign = -1.0f;	break;
		case tcu::CUBEFACE_NEGATIVE_Y: mRow = 1; sRow = 0; tRow = 2; mSign = -1.0f;				   tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_Y: mRow = 1; sRow = 0; tRow = 2;												break;
		case tcu::CUBEFACE_NEGATIVE_Z: mRow = 2; sRow = 0; tRow = 1; mSign = -1.0f; sSign = -1.0f; tSign = -1.0f;	break;
		case tcu::CUBEFACE_POSITIVE_Z: mRow = 2; sRow = 0; tRow = 1;							   tSign = -1.0f;	break;
		default:
			DE_ASSERT(DE_FALSE);
			return;
	}

	dst.resize(3*4);

	dst[0+mRow] = mSign;
	dst[3+mRow] = mSign;
	dst[6+mRow] = mSign;
	dst[9+mRow] = mSign;

	dst[0+sRow] = sSign * bottomLeft.x();
	dst[3+sRow] = sSign * bottomLeft.x();
	dst[6+sRow] = sSign * topRight.x();
	dst[9+sRow] = sSign * topRight.x();

	dst[0+tRow] = tSign * bottomLeft.y();
	dst[3+tRow] = tSign * topRight.y();
	dst[6+tRow] = tSign * bottomLeft.y();
	dst[9+tRow] = tSign * topRight.y();
}